

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

monitor_list * monitor_list_create(server_extension *extension,list *monitors)

{
  monitor_list *list;
  list *monitors_local;
  server_extension *extension_local;
  
  extension_local = (server_extension *)malloc(0x10);
  if (extension_local == (server_extension *)0x0) {
    extension_local = (server_extension *)0x0;
  }
  else {
    *(server_extension **)extension_local = extension;
    extension_local->data_cache = (xcb_query_extension_reply_t *)monitors;
  }
  return (monitor_list *)extension_local;
}

Assistant:

struct monitor_list *monitor_list_create(struct server_extension *extension, struct list *monitors)
{
        struct monitor_list *list = malloc(sizeof(struct monitor_list));

        if (list == NULL) {
                return NULL;
        }

        list->extension = extension;
        list->monitors = monitors;

        return list;
}